

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

void __thiscall NetworkDisable::NetworkDisable(NetworkDisable *this,CConnman *connman)

{
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_connman = connman;
  CConnman::SetNetworkActive(connman,false);
  if (((this->m_connman->fNetworkActive)._M_base._M_i & 1U) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Network activity could not be suspended.","");
    JSONRPCError(__return_storage_ptr__,-1,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(__return_storage_ptr__,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

NetworkDisable(CConnman& connman) : m_connman(connman) {
        m_connman.SetNetworkActive(false);
        if (m_connman.GetNetworkActive()) {
            throw JSONRPCError(RPC_MISC_ERROR, "Network activity could not be suspended.");
        }
    }